

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O2

void M3x3_MulVector(double (*m) [3],double *v,double *product)

{
  double dVar1;
  int i;
  long lVar2;
  long lVar3;
  double temp [3];
  
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    dVar1 = 0.0;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      dVar1 = dVar1 + (*m)[lVar3] * v[lVar3];
    }
    temp[lVar2] = dVar1;
    m = m + 1;
  }
  product[2] = temp[2];
  *product = temp[0];
  product[1] = temp[1];
  return;
}

Assistant:

void M3x3_MulVector(const double m[3][3], const double v[3], double product[3])
{
    int i, j;
    double temp[3];

    for (i=0 ; i<3 ; i++)
    {
        temp[i] = 0.0;

        for (j=0 ; j<3 ; j++)
        {
            temp[i] += m[i][j] * v[j];
        }
    }
    memcpy(product, temp, 3*sizeof(double));
}